

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

bool __thiscall Json::StreamWriterBuilder::validate(StreamWriterBuilder *this,Value *invalid)

{
  key_type *__k;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *key;
  _Alloc_hider _Var2;
  ArrayIndex AVar3;
  iterator iVar4;
  Value *pVVar5;
  Value *this_00;
  long lVar6;
  long lVar7;
  bool bVar8;
  Members keys;
  size_type __dnew;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  valid_keys;
  Value my_invalid;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  pointer local_a0;
  Value *local_98;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  Value *local_60;
  Value local_58;
  
  local_58.comments_.ptr_._M_t.
  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
  .
  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
  ._M_head_impl =
       (unique_ptr<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
        )(__uniq_ptr_data<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>,_true,_true>
          )0x0;
  Value::initBasic(&local_58,nullValue,false);
  local_98 = invalid;
  if (invalid == (Value *)0x0) {
    local_98 = &local_58;
  }
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&local_90);
  paVar1 = &local_c0.field_2;
  local_c0.field_2._M_allocated_capacity._0_5_ = 0x6e65646e69;
  local_c0.field_2._M_allocated_capacity._5_2_ = 0x6174;
  local_c0.field_2._M_local_buf[7] = 't';
  local_c0.field_2._M_local_buf[8] = 'i';
  local_c0.field_2._M_local_buf[9] = 'o';
  local_c0.field_2._M_local_buf[10] = 'n';
  local_c0._M_string_length = 0xb;
  local_c0.field_2._M_local_buf[0xb] = '\0';
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_90,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT17(local_c0.field_2._M_local_buf[7],
                             CONCAT25(local_c0.field_2._M_allocated_capacity._5_2_,
                                      local_c0.field_2._M_allocated_capacity._0_5_)) + 1);
  }
  local_c0.field_2._M_allocated_capacity._0_5_ = 0x656d6d6f63;
  local_c0.field_2._M_allocated_capacity._5_2_ = 0x746e;
  local_c0.field_2._M_local_buf[7] = 'S';
  local_c0.field_2._M_local_buf[8] = 't';
  local_c0.field_2._M_local_buf[9] = 'y';
  local_c0.field_2._M_local_buf[10] = 'l';
  local_c0.field_2._M_local_buf[0xb] = 'e';
  local_c0._M_string_length = 0xc;
  local_c0.field_2._M_local_buf[0xc] = '\0';
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_90,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT17(local_c0.field_2._M_local_buf[7],
                             CONCAT25(local_c0.field_2._M_allocated_capacity._5_2_,
                                      local_c0.field_2._M_allocated_capacity._0_5_)) + 1);
  }
  local_a0 = (pointer)0x17;
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  local_c0._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_c0,(ulong)&local_a0);
  local_c0.field_2._M_allocated_capacity._0_5_ = SUB85(local_a0,0);
  local_c0.field_2._M_allocated_capacity._5_2_ = (undefined2)((ulong)local_a0 >> 0x28);
  local_c0.field_2._M_local_buf[7] = (char)((ulong)local_a0 >> 0x38);
  builtin_strncpy(local_c0._M_dataplus._M_p,"enableYAMLCompatibility",0x17);
  local_c0._M_string_length = (size_type)local_a0;
  local_c0._M_dataplus._M_p[(long)local_a0] = '\0';
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_90,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT17(local_c0.field_2._M_local_buf[7],
                             CONCAT25(local_c0.field_2._M_allocated_capacity._5_2_,
                                      local_c0.field_2._M_allocated_capacity._0_5_)) + 1);
  }
  local_a0 = (pointer)0x14;
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  local_c0._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_c0,(ulong)&local_a0);
  local_c0.field_2._M_allocated_capacity._0_5_ = SUB85(local_a0,0);
  local_c0.field_2._M_allocated_capacity._5_2_ = (undefined2)((ulong)local_a0 >> 0x28);
  local_c0.field_2._M_local_buf[7] = (char)((ulong)local_a0 >> 0x38);
  builtin_strncpy(local_c0._M_dataplus._M_p,"dropNullPlaceholders",0x14);
  local_c0._M_string_length = (size_type)local_a0;
  local_c0._M_dataplus._M_p[(long)local_a0] = '\0';
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_90,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT17(local_c0.field_2._M_local_buf[7],
                             CONCAT25(local_c0.field_2._M_allocated_capacity._5_2_,
                                      local_c0.field_2._M_allocated_capacity._0_5_)) + 1);
  }
  local_a0 = (pointer)0x10;
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  local_c0._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_c0,(ulong)&local_a0);
  local_c0.field_2._M_allocated_capacity._0_5_ = SUB85(local_a0,0);
  local_c0.field_2._M_allocated_capacity._5_2_ = (undefined2)((ulong)local_a0 >> 0x28);
  local_c0.field_2._M_local_buf[7] = (char)((ulong)local_a0 >> 0x38);
  builtin_strncpy(local_c0._M_dataplus._M_p,"useSpecialFloats",0x10);
  local_c0._M_string_length = (size_type)local_a0;
  local_c0._M_dataplus._M_p[(long)local_a0] = '\0';
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_90,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT17(local_c0.field_2._M_local_buf[7],
                             CONCAT25(local_c0.field_2._M_allocated_capacity._5_2_,
                                      local_c0.field_2._M_allocated_capacity._0_5_)) + 1);
  }
  local_c0.field_2._M_allocated_capacity._0_5_ = 0x5574696d65;
  local_c0.field_2._M_allocated_capacity._5_2_ = 0x4654;
  local_c0.field_2._M_local_buf[7] = '8';
  local_c0._M_string_length = 8;
  local_c0.field_2._M_local_buf[8] = '\0';
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_90,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT17(local_c0.field_2._M_local_buf[7],
                             CONCAT25(local_c0.field_2._M_allocated_capacity._5_2_,
                                      local_c0.field_2._M_allocated_capacity._0_5_)) + 1);
  }
  local_c0.field_2._M_allocated_capacity._0_5_ = 0x6963657270;
  local_c0.field_2._M_allocated_capacity._5_2_ = 0x6973;
  local_c0.field_2._M_local_buf[7] = 'o';
  local_c0.field_2._M_local_buf[8] = 'n';
  local_c0.field_2._M_local_buf[9] = '\0';
  local_c0._M_string_length = 9;
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_90,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT17(local_c0.field_2._M_local_buf[7],
                             CONCAT25(local_c0.field_2._M_allocated_capacity._5_2_,
                                      local_c0.field_2._M_allocated_capacity._0_5_)) + 1);
  }
  local_c0.field_2._M_allocated_capacity._0_5_ = 0x6963657270;
  local_c0.field_2._M_allocated_capacity._5_2_ = 0x6973;
  local_c0.field_2._M_local_buf[7] = 'o';
  local_c0.field_2._M_local_buf[8] = 'n';
  local_c0.field_2._M_local_buf[9] = 'T';
  local_c0.field_2._M_local_buf[10] = 'y';
  local_c0.field_2._M_local_buf[0xb] = 'p';
  local_c0.field_2._M_local_buf[0xc] = 'e';
  local_c0._M_string_length = 0xd;
  local_c0.field_2._M_local_buf[0xd] = '\0';
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_90,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT17(local_c0.field_2._M_local_buf[7],
                             CONCAT25(local_c0.field_2._M_allocated_capacity._5_2_,
                                      local_c0.field_2._M_allocated_capacity._0_5_)) + 1);
  }
  local_60 = invalid;
  Value::getMemberNames_abi_cxx11_((Members *)&local_c0,&this->settings_);
  if (local_c0._M_string_length - (long)local_c0._M_dataplus._M_p != 0) {
    lVar7 = (long)(local_c0._M_string_length - (long)local_c0._M_dataplus._M_p) >> 5;
    lVar7 = lVar7 + (ulong)(lVar7 == 0);
    lVar6 = 0;
    do {
      _Var2._M_p = local_c0._M_dataplus._M_p;
      __k = (key_type *)(local_c0._M_dataplus._M_p + lVar6);
      iVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&local_90,__k);
      if ((_Rb_tree_header *)iVar4._M_node == &local_90._M_impl.super__Rb_tree_header) {
        pVVar5 = Value::operator[](&this->settings_,__k);
        key = *(char **)(_Var2._M_p + lVar6);
        this_00 = Value::resolveReference(local_98,key,key + *(long *)(_Var2._M_p + lVar6 + 8));
        Value::operator=(this_00,pVVar5);
      }
      lVar6 = lVar6 + 0x20;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
  }
  pVVar5 = &local_58;
  if (local_60 != (Value *)0x0) {
    pVVar5 = local_60;
  }
  bVar8 = false;
  if ((*(byte *)&pVVar5->bits_ < 8) &&
     (bVar8 = false, (0xc1U >> (*(byte *)&pVVar5->bits_ & 0x1f) & 1) != 0)) {
    AVar3 = Value::size(local_98);
    bVar8 = AVar3 == 0;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_c0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_90);
  Value::~Value(&local_58);
  return bVar8;
}

Assistant:

bool StreamWriterBuilder::validate(Json::Value* invalid) const {
  Json::Value my_invalid;
  if (!invalid)
    invalid = &my_invalid; // so we do not need to test for NULL
  Json::Value& inv = *invalid;
  std::set<String> valid_keys;
  getValidWriterKeys(&valid_keys);
  Value::Members keys = settings_.getMemberNames();
  size_t n = keys.size();
  for (size_t i = 0; i < n; ++i) {
    String const& key = keys[i];
    if (valid_keys.find(key) == valid_keys.end()) {
      inv[key] = settings_[key];
    }
  }
  return inv.empty();
}